

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,MDNode *md,bool decl)

{
  uint uVar1;
  MDOperand *md_00;
  uint index;
  uint64_t local_28;
  
  if (md != (MDNode *)0x0) {
    if (decl) {
      local_28 = MDNode::get_tween_id(md);
      append<char_const(&)[2],unsigned_long,char_const(&)[6]>
                (this,(char (*) [2])0x1a7929,&local_28,(char (*) [6])" = !{");
      index = 0;
      while( true ) {
        uVar1 = MDNode::getNumOperands(md);
        if (uVar1 <= index) break;
        md_00 = MDNode::getOperand(md,index);
        append(this,md_00);
        index = index + 1;
        uVar1 = MDNode::getNumOperands(md);
        if (index < uVar1) {
          std::operator<<((ostream *)this,", ");
        }
      }
      std::operator<<((ostream *)this,"}");
    }
    else {
      local_28 = MDNode::get_tween_id(md);
      append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1a7929,&local_28);
    }
    return;
  }
  std::operator<<((ostream *)this,"null");
  return;
}

Assistant:

void StreamState::append(MDNode *md, bool decl)
{
	if (md)
	{
		if (decl)
		{
			append("!", md->get_tween_id(), " = !{");
			for (unsigned i = 0; i < md->getNumOperands(); i++)
			{
				append(&md->getOperand(i));
				if (i + 1 < md->getNumOperands())
					append(", ");
			}
			append("}");
		}
		else
			append("!", md->get_tween_id());
	}
	else
		append("null");
}